

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O0

void __thiscall wasm::Analyzer::useRefFunc(Analyzer *this,Name func)

{
  ModuleElement element_00;
  ModuleElement element_01;
  Name name;
  Function *pFVar1;
  size_type sVar2;
  size_type sVar3;
  mapped_type *this_00;
  key_type local_68;
  HeapType type;
  undefined1 local_58 [8];
  ModuleElement element;
  pair<wasm::ModuleElementKind,_wasm::Name> local_38;
  Analyzer *local_20;
  Analyzer *this_local;
  Name func_local;
  
  func_local.super_IString.str._M_len = func.super_IString.str._M_str;
  this_local = func.super_IString.str._M_len;
  local_20 = this;
  if ((this->options->closedWorld & 1U) == 0) {
    element.second.super_IString.str._M_str._4_4_ = 0;
    std::pair<wasm::ModuleElementKind,_wasm::Name>::
    pair<wasm::ModuleElementKind,_wasm::Name_&,_true>
              (&local_38,(ModuleElementKind *)((long)&element.second.super_IString.str._M_str + 4),
               (Name *)&this_local);
    element_00.second.super_IString.str._M_len = local_38.second.super_IString.str._M_len;
    element_00.first = local_38.first;
    element_00._4_4_ = local_38._4_4_;
    element_00.second.super_IString.str._M_str = local_38.second.super_IString.str._M_str;
    use(this,element_00);
  }
  else {
    type.id._4_4_ = 0;
    std::pair<wasm::ModuleElementKind,_wasm::Name>::
    pair<wasm::ModuleElementKind,_wasm::Name_&,_true>
              ((pair<wasm::ModuleElementKind,_wasm::Name> *)local_58,
               (ModuleElementKind *)((long)&type.id + 4),(Name *)&this_local);
    name.super_IString.str._M_str = (char *)func_local.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)this_local;
    pFVar1 = Module::getFunction(this->module,name);
    local_68.id = (pFVar1->type).id;
    sVar2 = std::
            unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
            ::count(&this->calledSignatures,&local_68);
    if (sVar2 == 0) {
      this_00 = std::
                unordered_map<wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
                ::operator[](&this->uncalledRefFuncMap,&local_68);
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::insert(this_00,(value_type *)&this_local);
      std::
      unordered_set<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::hash<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::equal_to<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
      ::insert(&this->referenced,(value_type *)local_58);
    }
    else {
      sVar3 = std::
              unordered_map<wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>_>
              ::count(&this->uncalledRefFuncMap,&local_68);
      if (sVar3 != 0) {
        __assert_fail("uncalledRefFuncMap.count(type) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/RemoveUnusedModuleElements.cpp"
                      ,0x192,"void wasm::Analyzer::useRefFunc(Name)");
      }
      element_01.second.super_IString.str._M_len = element._0_8_;
      element_01._0_8_ = local_58;
      element_01.second.super_IString.str._M_str = (char *)element.second.super_IString.str._M_len;
      use(this,element_01);
    }
  }
  return;
}

Assistant:

void useRefFunc(Name func) {
    if (!options.closedWorld) {
      // The world is open, so assume the worst and something (inside or outside
      // of the module) can call this.
      use({ModuleElementKind::Function, func});
      return;
    }

    // Otherwise, we are in a closed world, and so we can try to optimize the
    // case where the target function is referenced but not used.
    auto element = ModuleElement{ModuleElementKind::Function, func};

    auto type = module->getFunction(func)->type;
    if (calledSignatures.count(type)) {
      // We must not have a type in both calledSignatures and
      // uncalledRefFuncMap: once it is called, we do not track RefFuncs for it
      // any more.
      assert(uncalledRefFuncMap.count(type) == 0);

      // We've seen a RefFunc for this, so it is used.
      use(element);
    } else {
      // We've never seen a CallRef for this, but might see one later.
      uncalledRefFuncMap[type].insert(func);

      referenced.insert(element);
    }
  }